

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsscreen.cpp
# Opt level: O2

QString * __thiscall QEglFSKmsScreen::model(QString *__return_storage_ptr__,QEglFSKmsScreen *this)

{
  QArrayDataPointer<char16_t> *other;
  
  other = &(this->m_edid).model.d;
  if ((this->m_edid).model.d.size == 0) {
    other = (QArrayDataPointer<char16_t> *)&this->m_edid;
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,other);
  return __return_storage_ptr__;
}

Assistant:

QString QEglFSKmsScreen::model() const
{
    return m_edid.model.isEmpty() ? m_edid.identifier : m_edid.model;
}